

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::findHoleBridge
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_80;
  
  dVar1 = hole->x;
  dVar2 = hole->y;
  dVar13 = -INFINITY;
  pNVar7 = (Node *)0x0;
  pNVar5 = outerNode;
  do {
    dVar8 = pNVar5->y;
    pNVar6 = pNVar5->next;
    if ((dVar2 <= dVar8) && (dVar14 = pNVar6->y, dVar14 <= dVar2)) {
      if ((dVar14 != dVar8) || (NAN(dVar14) || NAN(dVar8))) {
        dVar3 = pNVar5->x;
        dVar8 = ((pNVar6->x - dVar3) * (dVar2 - dVar8)) / (dVar14 - dVar8) + dVar3;
        if ((dVar8 <= dVar1) && (dVar13 < dVar8)) {
          pNVar7 = pNVar5;
          if (pNVar6->x <= dVar3) {
            pNVar7 = pNVar6;
          }
          dVar13 = dVar8;
          if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
            return pNVar7;
          }
        }
      }
    }
    pNVar5 = pNVar6;
  } while (pNVar6 != outerNode);
  if (pNVar7 == (Node *)0x0) {
    pNVar5 = (Node *)0x0;
  }
  else {
    dVar8 = pNVar7->y;
    dVar14 = dVar13;
    if (dVar8 <= dVar2) {
      dVar14 = dVar1;
    }
    dVar3 = pNVar7->x;
    local_80 = INFINITY;
    pNVar6 = pNVar7;
    pNVar5 = pNVar7;
    do {
      dVar10 = pNVar6->x;
      if ((((dVar1 != dVar10) || (NAN(dVar1) || NAN(dVar10))) && (dVar10 <= dVar1)) &&
         (dVar3 <= dVar10)) {
        dVar15 = dVar2 - pNVar6->y;
        dVar11 = (double)(~-(ulong)(dVar2 < dVar8) & (ulong)dVar13 |
                         -(ulong)(dVar2 < dVar8) & (ulong)dVar1) - dVar10;
        if (dVar11 * dVar15 <= (dVar14 - dVar10) * dVar15) {
          dVar12 = dVar8 - pNVar6->y;
          dVar9 = (dVar3 - dVar10) * dVar15;
          if (((dVar9 <= dVar11 * dVar12) && ((dVar14 - dVar10) * dVar12 <= dVar9)) &&
             (bVar4 = locallyInside(this,pNVar6,hole), bVar4)) {
            dVar10 = ABS(dVar15) / (dVar1 - dVar10);
            if (local_80 <= dVar10) {
              if (((dVar10 != local_80) || (NAN(dVar10) || NAN(local_80))) ||
                 ((pNVar6->x < pNVar5->x || pNVar6->x == pNVar5->x &&
                  (bVar4 = sectorContainsSector(this,pNVar5,pNVar6), !bVar4)))) goto LAB_003a2383;
            }
            pNVar5 = pNVar6;
            local_80 = dVar10;
          }
        }
      }
LAB_003a2383:
      pNVar6 = pNVar6->next;
    } while (pNVar6 != pNVar7);
  }
  return pNVar5;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::findHoleBridge(Node* hole, Node* outerNode) {
    Node* p = outerNode;
    double hx = hole->x;
    double hy = hole->y;
    double qx = -std::numeric_limits<double>::infinity();
    Node* m = nullptr;

    // find a segment intersected by a ray from the hole's leftmost Vertex to the left;
    // segment's endpoint with lesser x will be potential connection Vertex
    do {
        if (hy <= p->y && hy >= p->next->y && p->next->y != p->y) {
          double x = p->x + (hy - p->y) * (p->next->x - p->x) / (p->next->y - p->y);
          if (x <= hx && x > qx) {
            qx = x;
            m = p->x < p->next->x ? p : p->next;
            if (x == hx) return m; // hole touches outer segment; pick leftmost endpoint
          }
        }
        p = p->next;
    } while (p != outerNode);

    if (!m) return 0;

    // look for points inside the triangle of hole Vertex, segment intersection and endpoint;
    // if there are no points found, we have a valid connection;
    // otherwise choose the Vertex of the minimum angle with the ray as connection Vertex

    const Node* stop = m;
    double tanMin = std::numeric_limits<double>::infinity();
    double tanCur = 0;

    p = m;
    double mx = m->x;
    double my = m->y;

    do {
        if (hx >= p->x && p->x >= mx && hx != p->x &&
            pointInTriangle(hy < my ? hx : qx, hy, mx, my, hy < my ? qx : hx, hy, p->x, p->y)) {

            tanCur = std::abs(hy - p->y) / (hx - p->x); // tangential

            if (locallyInside(p, hole) &&
                (tanCur < tanMin || (tanCur == tanMin && (p->x > m->x || sectorContainsSector(m, p))))) {
                m = p;
                tanMin = tanCur;
            }
        }

        p = p->next;
    } while (p != stop);

    return m;
}